

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O1

void __thiscall
TPZFrontSym<std::complex<long_double>_>::SymbolicAddKel
          (TPZFrontSym<std::complex<long_double>_> *this,TPZVec<long> *destinationindex)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  lVar2 = destinationindex->fNElements;
  if (0 < lVar2) {
    lVar4 = 0;
    do {
      Local(this,destinationindex->fStore[lVar4]);
      (this->super_TPZFront<std::complex<long_double>_>).fFront =
           (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.fNElements;
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
  }
  lVar2 = (this->super_TPZFront<std::complex<long_double>_>).fFront;
  iVar1 = (this->super_TPZFront<std::complex<long_double>_>).fMaxFront;
  iVar3 = (int)lVar2;
  if (lVar2 < iVar1) {
    iVar3 = iVar1;
  }
  (this->super_TPZFront<std::complex<long_double>_>).fMaxFront = iVar3;
  return;
}

Assistant:

void TPZFrontSym<TVar>::SymbolicAddKel(TPZVec < int64_t > & destinationindex)
{
	int64_t i, loop_limit, aux;
	loop_limit=destinationindex.NElements();
	for(i=0;i<loop_limit;i++){
		aux=destinationindex[i];
		Local(aux);
		this->fFront = this->fGlobal.NElements();
	}
	this->fMaxFront=(this->fFront<this->fMaxFront)?this->fMaxFront:this->fFront;
	
}